

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scrubbers.cpp
# Opt level: O2

string * ApprovalTests::Scrubbers::scrubGuid(string *__return_storage_ptr__,string *input)

{
  int iVar1;
  int matchNumber;
  _Any_data local_60;
  code *local_50;
  code *local_48;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  matchIndices;
  
  if (scrubGuid(std::__cxx11::string_const&)::regex_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&scrubGuid(std::__cxx11::string_const&)::regex_abi_cxx11_);
    if (iVar1 != 0) {
      ::std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                (&scrubGuid(std::__cxx11::string_const&)::regex_abi_cxx11_,
                 "[0-9a-fA-F]{8}-[0-9a-fA-F]{4}-[0-9a-fA-F]{4}-[0-9a-fA-F]{4}-[0-9a-fA-F]{12}",0x10)
      ;
      __cxa_atexit(::std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::
                   ~basic_regex,&scrubGuid(std::__cxx11::string_const&)::regex_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&scrubGuid(std::__cxx11::string_const&)::regex_abi_cxx11_);
    }
  }
  local_60._8_8_ = &matchNumber;
  matchNumber = 0;
  matchIndices._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &matchIndices._M_t._M_impl.super__Rb_tree_header._M_header;
  matchIndices._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  matchIndices._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  matchIndices._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_60._M_unused._M_object = &matchIndices;
  local_48 = ::std::
             _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/ApprovalTests/scrubbers/Scrubbers.cpp:67:45)>
             ::_M_invoke;
  local_50 = ::std::
             _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/ApprovalTests/scrubbers/Scrubbers.cpp:67:45)>
             ::_M_manager;
  matchIndices._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       matchIndices._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  scrubRegex(__return_storage_ptr__,input,&scrubGuid(std::__cxx11::string_const&)::regex_abi_cxx11_,
             (RegexReplacer *)&local_60);
  ::std::_Function_base::~_Function_base((_Function_base *)&local_60);
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~_Rb_tree(&matchIndices._M_t);
  return __return_storage_ptr__;
}

Assistant:

std::string scrubGuid(const std::string& input)
        {
            static const std::regex regex("[0-9a-fA-F]{8}-[0-9a-fA-F]{4}-[0-9a-fA-F]{4}-["
                                          "0-9a-fA-F]{4}-[0-9a-fA-F]{12}");

            int matchNumber = 0;
            std::map<std::string, int> matchIndices;
            return scrubRegex(input, regex, [&](const RegexMatch& m) {
                auto guid_match = m.str();

                if (matchIndices[guid_match] == 0)
                {
                    matchIndices[guid_match] = ++matchNumber;
                }
                return "guid_" + std::to_string(matchIndices[guid_match]);
            });
        }